

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySubImage3D::testCopyTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLboolean *test_passed)

{
  bool bVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_1b0;
  GLboolean *local_30;
  GLboolean *test_passed_local;
  SubImage3DCopyParams *copy_params_local;
  GLuint local_18;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArraySubImage3D *this_local;
  
  local_30 = test_passed;
  test_passed_local = (GLboolean *)copy_params;
  copy_params_local._4_4_ = depth;
  local_18 = height;
  depth_local = width;
  _height_local = this;
  clearCubeMapArrayTexture(this,width,height,depth,0);
  copyTexSubImage3D(this,(SubImage3DCopyParams *)test_passed_local);
  bVar1 = checkResults(this,depth_local,local_18,copy_params_local._4_4_);
  if (!bVar1) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [80])
                        "glCopyTexSubImage3D failed to copy data to texture cube map array\'s data store\n"
                       );
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [58])
                               "Texture Cube Map Array Dimensions (width, height, depth) ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&depth_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)((long)&copy_params_local + 4));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c2d560);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [60])
                               "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)test_passed_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(test_passed_local + 4));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(test_passed_local + 8));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c2d560);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [57])
                               "Texture Cube Map Array Copy Size (width, height, depth) ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b0b32f);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(test_passed_local + 0xc));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(test_passed_local + 0x10));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2c6b075);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(test_passed_local + 0x14));
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c2d560);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    *local_30 = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::testCopyTexSubImage3D(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														  const SubImage3DCopyParams& copy_params,
														  glw::GLboolean&			  test_passed)
{
	clearCubeMapArrayTexture(width, height, depth, 0);

	copyTexSubImage3D(copy_params);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glCopyTexSubImage3D failed to copy data to texture cube map array's data store\n"
						   << "Texture Cube Map Array Dimensions (width, height, depth) "
						   << "(" << width << "," << height << "," << depth << ")\n"
						   << "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
						   << "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << ","
						   << copy_params.m_zoffset << ")\n"
						   << "Texture Cube Map Array Copy Size (width, height, depth) "
						   << "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth
						   << ")\n"
						   << tcu::TestLog::EndMessage;

		test_passed = false;
	}
}